

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  byte *pbVar4;
  Message *pMVar5;
  uchar value;
  string local_68;
  char local_46 [21];
  byte local_31;
  ulong uStack_30;
  char ch;
  size_t i;
  Message m;
  bool is_attribute_local;
  string *str_local;
  
  m.ss_.ptr_._7_1_ = is_attribute;
  Message::Message((Message *)&i);
  for (uStack_30 = 0; uVar1 = uStack_30, uVar3 = std::__cxx11::string::size(), uVar1 < uVar3;
      uStack_30 = uStack_30 + 1) {
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)str);
    local_31 = *pbVar4;
    switch(local_31) {
    case 0x22:
      if ((m.ss_.ptr_._7_1_ & 1) == 0) {
        local_46[0] = '\"';
        Message::operator<<((Message *)&i,local_46);
      }
      else {
        Message::operator<<((Message *)&i,(char (*) [7])"&quot;");
      }
      break;
    default:
      bVar2 = IsValidXmlCharacter(local_31);
      if (bVar2) {
        if (((m.ss_.ptr_._7_1_ & 1) == 0) || (bVar2 = IsNormalizableWhitespace(local_31), !bVar2)) {
          Message::operator<<((Message *)&i,(char *)&local_31);
        }
        else {
          pMVar5 = Message::operator<<((Message *)&i,(char (*) [4])"&#x");
          String::FormatByte_abi_cxx11_(&local_68,(String *)(ulong)local_31,value);
          pMVar5 = Message::operator<<(pMVar5,&local_68);
          Message::operator<<(pMVar5,(char (*) [2])0x760ff5);
          std::__cxx11::string::~string((string *)&local_68);
        }
      }
      break;
    case 0x26:
      Message::operator<<((Message *)&i,(char (*) [6])"&amp;");
      break;
    case 0x27:
      if ((m.ss_.ptr_._7_1_ & 1) == 0) {
        local_46[1] = 0x27;
        Message::operator<<((Message *)&i,local_46 + 1);
      }
      else {
        Message::operator<<((Message *)&i,(char (*) [7])"&apos;");
      }
      break;
    case 0x3c:
      Message::operator<<((Message *)&i,(char (*) [5])"&lt;");
      break;
    case 0x3e:
      Message::operator<<((Message *)&i,(char (*) [5])"&gt;");
    }
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&i);
  Message::~Message((Message *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}